

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O3

int QWindowsStylePrivate::fixedPixelMetric(PixelMetric pm)

{
  if ((int)pm < 0x23) {
    if ((int)pm < 0x10) {
      if (pm - PM_ButtonShiftHorizontal < 2) {
        return 1;
      }
      if (pm == PM_ButtonDefaultIndicator) {
        return 1;
      }
      if (pm == PM_SliderLength) {
        return 0xb;
      }
    }
    else if ((int)pm < 0x1c) {
      if (pm == PM_DockWidgetSeparatorExtent) {
        return 4;
      }
      if (pm == PM_DockWidgetFrameWidth) {
        return 4;
      }
    }
    else {
      if (pm - PM_MenuHMargin < 2) {
        return 1;
      }
      if (pm == PM_MenuBarPanelWidth) {
        return 0;
      }
    }
  }
  else if ((int)pm < 0x46) {
    switch(pm) {
    case PM_TabBarTabShiftHorizontal:
    case PM_ToolBarItemSpacing:
      return 0;
    case PM_TabBarTabShiftVertical:
      goto switchD_003a35b2_caseD_32;
    case PM_TabBarScrollButtonWidth:
    case PM_ToolBarFrameWidth:
    case PM_ToolBarSeparatorExtent:
    case PM_ToolBarExtensionExtent:
    case PM_SpinBoxSliderHeight:
    case PM_ToolBarIconSize:
    case PM_ListViewIconSize:
    case PM_IconViewIconSize:
      break;
    case PM_ToolBarHandleExtent:
      return 10;
    case PM_ToolBarItemMargin:
      return 1;
    case PM_SmallIconSize:
      return 0x10;
    case PM_LargeIconSize:
      return 0x20;
    default:
      if (pm - PM_MenuBarVMargin < 2) {
        return 0;
      }
    }
  }
  else {
    if (pm == PM_DockWidgetTitleMargin) {
switchD_003a35b2_caseD_32:
      return 2;
    }
    if (pm == PM_DockWidgetTitleBarButtonMargin) {
      return 4;
    }
  }
  return -0x5c18;
}

Assistant:

int QWindowsStylePrivate::fixedPixelMetric(QStyle::PixelMetric pm)
{
    switch (pm) {
    case QStyle::PM_ToolBarItemSpacing:
        return 0;
    case QStyle::PM_ButtonDefaultIndicator:
    case QStyle::PM_ButtonShiftHorizontal:
    case QStyle::PM_ButtonShiftVertical:
    case QStyle::PM_MenuHMargin:
    case QStyle::PM_MenuVMargin:
    case QStyle::PM_ToolBarItemMargin:
        return 1;
    case QStyle::PM_DockWidgetSeparatorExtent:
        return 4;
#if QT_CONFIG(tabbar)
    case QStyle::PM_TabBarTabShiftHorizontal:
        return 0;
    case QStyle::PM_TabBarTabShiftVertical:
        return 2;
#endif

#if QT_CONFIG(slider)
    case QStyle::PM_SliderLength:
        return 11;
#endif // QT_CONFIG(slider)

#if QT_CONFIG(menu)
    case QStyle::PM_MenuBarHMargin:
    case QStyle::PM_MenuBarVMargin:
    case QStyle::PM_MenuBarPanelWidth:
        return 0;
    case QStyle::PM_SmallIconSize:
        return 16;
    case QStyle::PM_LargeIconSize:
        return 32;
    case QStyle::PM_DockWidgetTitleMargin:
        return 2;
    case QStyle::PM_DockWidgetTitleBarButtonMargin:
    case QStyle::PM_DockWidgetFrameWidth:
        return 4;

#endif // QT_CONFIG(menu)
    case QStyle::PM_ToolBarHandleExtent:
        return 10;
    default:
        break;
    }
    return QWindowsStylePrivate::InvalidMetric;
}